

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmstradCPC.cpp
# Opt level: O0

bool __thiscall
AmstradCPC::ConcreteMachine<true>::insert_media(ConcreteMachine<true> *this,Media *media)

{
  Media *this_00;
  bool bVar1;
  const_reference pvVar2;
  bool local_91;
  shared_ptr<Storage::Disk::Disk> local_68;
  reference local_58;
  shared_ptr<Storage::Disk::Disk> *disk;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
  *__range2;
  int c;
  shared_ptr<Storage::Tape::Tape> local_28;
  Media *local_18;
  Media *media_local;
  ConcreteMachine<true> *this_local;
  
  local_18 = media;
  media_local = (Media *)this;
  bVar1 = std::
          vector<std::shared_ptr<Storage::Tape::Tape>,_std::allocator<std::shared_ptr<Storage::Tape::Tape>_>_>
          ::empty(&media->tapes);
  if (!bVar1) {
    pvVar2 = std::
             vector<std::shared_ptr<Storage::Tape::Tape>,_std::allocator<std::shared_ptr<Storage::Tape::Tape>_>_>
             ::front(&local_18->tapes);
    std::shared_ptr<Storage::Tape::Tape>::shared_ptr(&local_28,pvVar2);
    Storage::Tape::TapePlayer::set_tape(&(this->tape_player_).super_TapePlayer,&local_28);
    std::shared_ptr<Storage::Tape::Tape>::~shared_ptr(&local_28);
    set_use_fast_tape_hack(this);
  }
  this_00 = local_18;
  __range2._0_4_ = 0;
  __end2 = std::
           vector<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
           ::begin(&local_18->disks);
  disk = (shared_ptr<Storage::Disk::Disk> *)
         std::
         vector<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
         ::end(&this_00->disks);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_std::shared_ptr<Storage::Disk::Disk>_*,_std::vector<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>_>
                                     *)&disk), bVar1) {
    local_58 = __gnu_cxx::
               __normal_iterator<const_std::shared_ptr<Storage::Disk::Disk>_*,_std::vector<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>_>
               ::operator*(&__end2);
    std::shared_ptr<Storage::Disk::Disk>::shared_ptr(&local_68,local_58);
    Amstrad::FDC::set_disk(&this->fdc_,&local_68,(int)__range2);
    std::shared_ptr<Storage::Disk::Disk>::~shared_ptr(&local_68);
    __range2._0_4_ = (int)__range2 + 1;
    if ((int)__range2 == 4) break;
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<Storage::Disk::Disk>_*,_std::vector<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>_>
    ::operator++(&__end2);
  }
  bVar1 = std::
          vector<std::shared_ptr<Storage::Tape::Tape>,_std::allocator<std::shared_ptr<Storage::Tape::Tape>_>_>
          ::empty(&local_18->tapes);
  local_91 = true;
  if (bVar1) {
    local_91 = std::
               vector<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
               ::empty(&local_18->disks);
    local_91 = !local_91;
  }
  return local_91;
}

Assistant:

bool insert_media(const Analyser::Static::Media &media) final {
			// If there are any tapes supplied, use the first of them.
			if(!media.tapes.empty()) {
				tape_player_.set_tape(media.tapes.front());
				set_use_fast_tape_hack();
			}

			// Insert up to four disks.
			int c = 0;
			for(auto &disk : media.disks) {
				fdc_.set_disk(disk, c);
				c++;
				if(c == 4) break;
			}

			return !media.tapes.empty() || (!media.disks.empty() && has_fdc);
		}